

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,RecyclableObject **key,RecyclableObject **value)

{
  Type *pTVar1;
  RecyclableObject *pRVar2;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
  *pSVar3;
  int *piVar4;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
  *pSVar5;
  code *pcVar6;
  char cVar7;
  WriteBarrierPtr<Js::RecyclableObject> WVar8;
  BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar9;
  bool bVar10;
  int iVar11;
  undefined4 *puVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  WriteBarrierPtr<Js::RecyclableObject> local_70;
  RecyclableObject **local_68;
  RecyclableObject **local_60;
  long local_58;
  RecyclableObject *local_50;
  BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_48;
  ulong local_40;
  uint local_34;
  
  lVar15 = *(long *)this;
  local_60 = value;
  if (lVar15 == 0) {
    BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar15 = *(long *)this;
  }
  uVar14 = (uint)((ulong)*key >> 3) | 1;
  local_40 = (ulong)uVar14;
  local_34 = BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             ::GetBucket(uVar14,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar14 = *(uint *)(lVar15 + (ulong)local_34 * 4);
  local_48 = (BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar14 < 0) {
    cVar7 = (char)(uVar14 >> 0x18);
    uVar16 = 0;
  }
  else {
    lVar15 = *(long *)(this + 8);
    uVar16 = 0;
    local_68 = key;
    do {
      pRVar2 = *(RecyclableObject **)(lVar15 + (ulong)uVar14 * 0x10);
      Memory::Recycler::WBSetBit((char *)&local_50);
      key = local_68;
      local_50 = pRVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
      if (local_50 == *key) {
        if (local_48->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(local_48->stats,uVar16);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar10) {
          *puVar12 = 0;
          return -1;
        }
        goto LAB_00cdf4f2;
      }
      uVar16 = uVar16 + 1;
      uVar14 = *(uint *)((ulong)uVar14 * 0x10 + lVar15 + 8);
    } while (-1 < (int)uVar14);
    cVar7 = (char)(uVar14 >> 0x18);
  }
  pBVar9 = local_48;
  if (local_48->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_48->stats,uVar16);
  }
  iVar11 = -1;
  if (cVar7 < '\0') {
    if (pBVar9->freeCount == 0) {
      uVar14 = pBVar9->count;
      if (uVar14 == pBVar9->size) {
        BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Resize(pBVar9);
        local_34 = BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::GetBucket((hash_t)local_40,pBVar9->bucketCount,pBVar9->modFunctionIndex);
        uVar14 = pBVar9->count;
      }
      uVar13 = (ulong)uVar14;
      pBVar9->count = uVar14 + 1;
      if (pBVar9->size < (int)(uVar14 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f1,"(count <= size)","count <= size");
        if (!bVar10) goto LAB_00cdf4f2;
        *puVar12 = 0;
      }
      if (pBVar9->size <= (int)uVar14) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f2,"(index < size)","index < size");
        if (!bVar10) goto LAB_00cdf4f2;
        *puVar12 = 0;
      }
    }
    else {
      if (pBVar9->freeCount < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar10) goto LAB_00cdf4f2;
        *puVar12 = 0;
      }
      if (pBVar9->freeList < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar10) goto LAB_00cdf4f2;
        *puVar12 = 0;
      }
      if (pBVar9->count <= pBVar9->freeList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar10) {
LAB_00cdf4f2:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar12 = 0;
      }
      uVar13 = (ulong)(uint)pBVar9->freeList;
      pTVar1 = &pBVar9->freeCount;
      *pTVar1 = *pTVar1 + -1;
      if (*pTVar1 != 0) {
        iVar11 = BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::GetNextFreeEntryIndex((pBVar9->entries).ptr + pBVar9->freeList);
        pBVar9->freeList = iVar11;
      }
    }
    pSVar3 = (pBVar9->entries).ptr;
    lVar15 = (long)(int)uVar13;
    pSVar5 = pSVar3 + lVar15;
    pRVar2 = *key;
    local_58 = lVar15;
    local_40 = uVar13;
    Memory::Recycler::WBSetBit((char *)&local_50);
    local_50 = pRVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
    pRVar2 = *local_60;
    Memory::Recycler::WBSetBit((char *)&local_70);
    local_70.ptr = pRVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_70);
    WVar8.ptr = local_70.ptr;
    Memory::Recycler::WBSetBit((char *)pSVar5);
    pBVar9 = local_48;
    pSVar3[lVar15].
    super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .
    super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>_>
    .super_ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>.value.ptr = WVar8.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar5);
    piVar4 = (pBVar9->buckets).ptr;
    pSVar5 = (pBVar9->entries).ptr;
    pSVar5[lVar15].
    super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .
    super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>_>
    .super_ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>.next = piVar4[local_34];
    iVar11 = (int)local_40;
    piVar4[local_34] = (int)local_58;
    uVar16 = 0;
    uVar13 = local_40 & 0xffffffff;
    do {
      uVar14 = pSVar5[(int)uVar13].
               super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
               .
               super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
               .
               super_ValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>_>
               .super_ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>.next;
      uVar13 = (ulong)uVar14;
      uVar16 = uVar16 + 1;
    } while (uVar14 != 0xffffffff);
    if (pBVar9->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(pBVar9->stats,uVar16);
    }
  }
  return iVar11;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }